

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O0

Gia_Man_t *
Gia_ManPerformFx(Gia_Man_t *p,int nNewNodesMax,int LitCountMax,int fReverse,int fVerbose,
                int fVeryVerbose)

{
  int iVar1;
  Vec_Wec_t *vCubes_00;
  Vec_Str_t *local_48;
  Vec_Str_t *vCompl;
  Vec_Wec_t *vCubes;
  Gia_Man_t *pNew;
  int local_28;
  int fVeryVerbose_local;
  int fVerbose_local;
  int fReverse_local;
  int LitCountMax_local;
  int nNewNodesMax_local;
  Gia_Man_t *p_local;
  
  vCubes = (Vec_Wec_t *)0x0;
  pNew._4_4_ = fVeryVerbose;
  local_28 = fVerbose;
  fVeryVerbose_local = fReverse;
  fVerbose_local = LitCountMax;
  fReverse_local = nNewNodesMax;
  _LitCountMax_local = p;
  iVar1 = Gia_ManAndNum(p);
  if (iVar1 == 0) {
    p_local = Gia_ManDup(_LitCountMax_local);
  }
  else {
    iVar1 = Gia_ManHasMapping(_LitCountMax_local);
    if (iVar1 == 0) {
      __assert_fail("Gia_ManHasMapping(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                    ,0x1d1,"Gia_Man_t *Gia_ManPerformFx(Gia_Man_t *, int, int, int, int, int)");
    }
    vCubes_00 = Gia_ManFxRetrieve(_LitCountMax_local,&local_48,fVeryVerbose_local);
    vCompl = (Vec_Str_t *)vCubes_00;
    iVar1 = Vec_StrSize(local_48);
    Fx_FastExtract(vCubes_00,iVar1,fReverse_local,fVerbose_local,local_28,pNew._4_4_);
    vCubes = (Vec_Wec_t *)Gia_ManFxInsert(_LitCountMax_local,(Vec_Wec_t *)vCompl,local_48);
    Gia_ManTransferTiming((Gia_Man_t *)vCubes,_LitCountMax_local);
    Vec_WecFree((Vec_Wec_t *)vCompl);
    Vec_StrFree(local_48);
    p_local = (Gia_Man_t *)vCubes;
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManPerformFx( Gia_Man_t * p, int nNewNodesMax, int LitCountMax, int fReverse, int fVerbose, int fVeryVerbose )
{
    extern int Fx_FastExtract( Vec_Wec_t * vCubes, int ObjIdMax, int nNewNodesMax, int LitCountMax, int fVerbose, int fVeryVerbose );
    Gia_Man_t * pNew = NULL;
    Vec_Wec_t * vCubes;
    Vec_Str_t * vCompl;
    if ( Gia_ManAndNum(p) == 0 )
        return Gia_ManDup(p);
//    abctime clk;
    assert( Gia_ManHasMapping(p) );   
    // collect information
    vCubes = Gia_ManFxRetrieve( p, &vCompl, fReverse );
    // call the fast extract procedure
//    clk = Abc_Clock();
    Fx_FastExtract( vCubes, Vec_StrSize(vCompl), nNewNodesMax, LitCountMax, fVerbose, fVeryVerbose );
//    Abc_PrintTime( 1, "Fx runtime", Abc_Clock() - clk );
    // insert information
    pNew = Gia_ManFxInsert( p, vCubes, vCompl );
    Gia_ManTransferTiming( pNew, p );
    // cleanup
    Vec_WecFree( vCubes );
    Vec_StrFree( vCompl );
    return pNew;
}